

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

Logger * __thiscall higan::Logger::operator<<(Logger *this,string *str)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  
  sVar1 = (this->buffer_).write_idx_;
  iVar2 = snprintf((this->buffer_).buffer_ + sVar1,sVar1 - (this->buffer_).read_idx_,"%s",
                   (str->_M_dataplus)._M_p);
  uVar3 = (long)iVar2 + (this->buffer_).write_idx_;
  if (0x1ff < uVar3) {
    uVar3 = 0x200;
  }
  (this->buffer_).write_idx_ = uVar3;
  return this;
}

Assistant:

Logger& Logger::operator<<(const std::string& str)
{
	return *this << str.c_str();
}